

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.hpp
# Opt level: O1

void __thiscall
duckdb::ParquetUnionData::ParquetUnionData(ParquetUnionData *this,OpenFileInfo *file_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  size_type *local_38;
  size_type local_28;
  undefined8 uStack_20;
  
  local_38 = (size_type *)(file_p->path)._M_dataplus._M_p;
  paVar1 = &(file_p->path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38 == paVar1) {
    local_28 = paVar1->_M_allocated_capacity;
    uStack_20 = *(undefined8 *)((long)&(file_p->path).field_2 + 8);
    local_38 = &local_28;
  }
  else {
    local_28 = paVar1->_M_allocated_capacity;
  }
  sVar2 = (file_p->path)._M_string_length;
  (file_p->path)._M_dataplus._M_p = (pointer)paVar1;
  (file_p->path)._M_string_length = 0;
  (file_p->path).field_2._M_local_buf[0] = '\0';
  peVar3 = (file_p->extended_info).internal.
           super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (file_p->extended_info).internal.
           super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (file_p->extended_info).internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (file_p->extended_info).internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_BaseUnionData)._vptr_BaseUnionData = (_func_int **)&PTR__BaseUnionData_024a1918;
  paVar1 = &(this->super_BaseUnionData).file.path.field_2;
  (this->super_BaseUnionData).file.path._M_dataplus._M_p = (pointer)paVar1;
  if (local_38 == &local_28) {
    paVar1->_M_allocated_capacity = local_28;
    *(undefined8 *)((long)&(this->super_BaseUnionData).file.path.field_2 + 8) = uStack_20;
  }
  else {
    (this->super_BaseUnionData).file.path._M_dataplus._M_p = (pointer)local_38;
    (this->super_BaseUnionData).file.path.field_2._M_allocated_capacity = local_28;
  }
  (this->super_BaseUnionData).file.path._M_string_length = sVar2;
  (this->super_BaseUnionData).file.extended_info.internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  (this->super_BaseUnionData).file.extended_info.internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_BaseUnionData).file.extended_info.internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var4;
  (this->super_BaseUnionData).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_BaseUnionData).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_BaseUnionData).names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_BaseUnionData).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_BaseUnionData).names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_BaseUnionData).names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_BaseUnionData).reader.internal.
  super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_BaseUnionData).reader.internal.
  super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_BaseUnionData)._vptr_BaseUnionData = (_func_int **)&PTR__ParquetUnionData_024b67a0;
  (this->options).binary_as_string = false;
  (this->options).file_row_number = false;
  (this->options).encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->options).encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->options).debug_use_openssl = true;
  (this->options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->options).explicit_cardinality = 0;
  (this->metadata).internal.
  super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->metadata).internal.
  super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

explicit ParquetUnionData(OpenFileInfo file_p) : BaseUnionData(std::move(file_p)) {
	}